

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdapi_key.cpp
# Opt level: O1

Privkey * __thiscall
cfd::api::KeyApi::CreateKeyPair
          (Privkey *__return_storage_ptr__,KeyApi *this,bool is_compressed,Pubkey *pubkey,
          string *wif,NetType net_type)

{
  Pubkey out_pubkey;
  Pubkey local_60;
  string local_48;
  
  core::Privkey::GenerageRandomKey();
  core::Privkey::GeneratePubkey(&local_60,__return_storage_ptr__,is_compressed);
  if (pubkey != (Pubkey *)0x0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pubkey,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60);
  }
  if (wif != (string *)0x0) {
    core::Privkey::ConvertWif_abi_cxx11_(&local_48,__return_storage_ptr__,net_type,is_compressed);
    std::__cxx11::string::operator=((string *)wif,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
  }
  if (local_60.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_60.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Privkey KeyApi::CreateKeyPair(
    bool is_compressed, Pubkey* pubkey, std::string* wif, NetType net_type) {
  // generate random private key
  Privkey privkey = Privkey::GenerageRandomKey();

  // derive pubkey from private key
  const Pubkey out_pubkey = privkey.GeneratePubkey(is_compressed);

  if (pubkey != nullptr) {
    *pubkey = out_pubkey;
  }

  if (wif != nullptr) {
    *wif = privkey.ConvertWif(net_type, is_compressed);
  }
  return privkey;
}